

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O0

void stream_encoder_end(void *coder_ptr,lzma_allocator *allocator)

{
  long local_28;
  size_t i;
  lzma_stream_coder_conflict *coder;
  lzma_allocator *allocator_local;
  void *coder_ptr_local;
  
  lzma_next_end((lzma_next_coder *)((long)coder_ptr + 8),allocator);
  lzma_next_end((lzma_next_coder *)((long)coder_ptr + 0x170),allocator);
  lzma_index_end(*(lzma_index **)((long)coder_ptr + 0x1b8),allocator);
  local_28 = 0;
  while (*(long *)((long)coder_ptr + local_28 * 0x10 + 0x120) != -1) {
    lzma_free(*(void **)((long)coder_ptr + local_28 * 0x10 + 0x128),allocator);
    local_28 = local_28 + 1;
  }
  lzma_free(coder_ptr,allocator);
  return;
}

Assistant:

static void
stream_encoder_end(void *coder_ptr, const lzma_allocator *allocator)
{
	lzma_stream_coder *coder = coder_ptr;

	lzma_next_end(&coder->block_encoder, allocator);
	lzma_next_end(&coder->index_encoder, allocator);
	lzma_index_end(coder->index, allocator);

	for (size_t i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	lzma_free(coder, allocator);
	return;
}